

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::
     log<char_const(&)[35],kj::_::DebugComparison<kj::MappedIterator<kj::_::BTreeImpl::Iterator,kj::_::TableMapping<kj::TreeMap<kj::String,int>::Entry>>&,kj::MappedIterator<kj::_::BTreeImpl::Iterator,kj::_::TableMapping<kj::TreeMap<kj::String,int>::Entry>>>&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [35],
               DebugComparison<kj::MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<kj::String,_int>::Entry>_>_&,_kj::MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<kj::String,_int>::Entry>_>_>
               *params_1)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  long lVar3;
  String argValues [2];
  ArrayPtr<kj::String> in_stack_ffffffffffffff68;
  char *apcStack_88 [2];
  size_t sStack_78;
  ArrayDisposer *pAStack_70;
  String local_60;
  StringPtr local_48;
  char *local_38;
  undefined8 local_30;
  
  str<char_const(&)[35]>
            ((String *)&stack0xffffffffffffff68,(kj *)params,
             (char (*) [35])CONCAT44(in_register_00000014,severity));
  local_38 = "(can\'t stringify)";
  local_30 = 0x12;
  local_48.content.ptr = "(can\'t stringify)";
  local_48.content.size_ = 0x12;
  concat<kj::StringPtr,kj::StringPtr&,kj::StringPtr>
            (&local_60,(_ *)&local_38,(StringPtr *)params_1->op,&local_48,(StringPtr *)params);
  apcStack_88[1] = local_60.content.ptr;
  sStack_78 = local_60.content.size_;
  pAStack_70 = local_60.content.disposer;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              &stack0xffffffffffffff68,in_stack_ffffffffffffff68);
  lVar3 = 0x18;
  do {
    lVar1 = *(long *)(&stack0xffffffffffffff68 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)(&stack0xffffffffffffff70 + lVar3);
      *(undefined8 *)(&stack0xffffffffffffff68 + lVar3) = 0;
      *(undefined8 *)(&stack0xffffffffffffff70 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)apcStack_88 + lVar3))
                (*(undefined8 **)((long)apcStack_88 + lVar3),lVar1,1,uVar2,uVar2,0);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}